

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O0

void __thiscall CEExecOptions::SetProgName(CEExecOptions *this,string *prog_name)

{
  string *in_RSI;
  long in_RDI;
  string vers_str;
  char *in_stack_ffffffffffffff30;
  allocator *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  allocator local_81;
  string local_80 [48];
  string local_50 [24];
  string *in_stack_ffffffffffffffc8;
  string *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  CLOptions *in_stack_ffffffffffffffe0;
  
  std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x218),in_RSI);
  paVar1 = &local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"",paVar1);
  paVar1 = (allocator *)&stack0xffffffffffffff57;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff58,"",paVar1);
  CLOptions::AddVersionInfo
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

inline
void CEExecOptions::SetProgName(const std::string& prog_name)
{
    std::string vers_str = prog_name + " v" + CPPEPHEM_VERSION;
    prog_name_ = prog_name;
    AddVersionInfo(vers_str);
}